

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

GenerateRegionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::GenerateRegionSyntax,slang::syntax::GenerateRegionSyntax_const&>
          (BumpAllocator *this,GenerateRegionSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  GenerateRegionSyntax *pGVar8;
  
  pGVar8 = (GenerateRegionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((GenerateRegionSyntax *)this->endPtr < pGVar8 + 1) {
    pGVar8 = (GenerateRegionSyntax *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(pGVar8 + 1);
  }
  (pGVar8->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar4 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pGVar8->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pGVar8->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pGVar8->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar4 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005b7e60;
  (pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pGVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pGVar8->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pGVar8->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005bad98;
  uVar5 = (args->keyword).field_0x2;
  NVar6.raw = (args->keyword).numFlags.raw;
  uVar7 = (args->keyword).rawLen;
  pIVar3 = (args->keyword).info;
  (pGVar8->keyword).kind = (args->keyword).kind;
  (pGVar8->keyword).field_0x2 = uVar5;
  (pGVar8->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pGVar8->keyword).rawLen = uVar7;
  (pGVar8->keyword).info = pIVar3;
  uVar4 = *(undefined4 *)&(args->members).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->members).super_SyntaxListBase.super_SyntaxNode.parent;
  (pGVar8->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->members).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pGVar8->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pGVar8->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pGVar8->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->members).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pGVar8->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005b7e60;
  (pGVar8->members).super_SyntaxListBase.childCount =
       (args->members).super_SyntaxListBase.childCount;
  sVar2 = (args->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (pGVar8->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr;
  (pGVar8->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pGVar8->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005bae20
  ;
  uVar5 = (args->endgenerate).field_0x2;
  NVar6.raw = (args->endgenerate).numFlags.raw;
  uVar7 = (args->endgenerate).rawLen;
  pIVar3 = (args->endgenerate).info;
  (pGVar8->endgenerate).kind = (args->endgenerate).kind;
  (pGVar8->endgenerate).field_0x2 = uVar5;
  (pGVar8->endgenerate).numFlags = (NumericTokenFlags)NVar6.raw;
  (pGVar8->endgenerate).rawLen = uVar7;
  (pGVar8->endgenerate).info = pIVar3;
  return pGVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }